

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

image * new_image(size_t width,size_t height,size_t channel_count)

{
  image *piVar1;
  void *pvVar2;
  ulong local_30;
  size_t i;
  image *image;
  size_t channel_count_local;
  size_t height_local;
  size_t width_local;
  
  piVar1 = (image *)xmalloc(channel_count * 8 + 0x18);
  piVar1->width = width;
  piVar1->height = height;
  piVar1->channel_count = channel_count;
  for (local_30 = 0; local_30 < channel_count; local_30 = local_30 + 1) {
    pvVar2 = xmalloc(width * 4 * height);
    (&piVar1[1].width)[local_30] = (size_t)pvVar2;
  }
  return piVar1;
}

Assistant:

static inline struct image* new_image(size_t width, size_t height, size_t channel_count) {
    struct image* image = xmalloc(sizeof(struct image) + sizeof(real_t*) * channel_count);
    image->width = width;
    image->height = height;
    image->channel_count = channel_count;
    for (size_t i = 0; i < channel_count; ++i)
        image->channels[i] = xmalloc(sizeof(real_t) * width * height);
    return image;
}